

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * __thiscall ODDLParser::OpenDDLParser::parseHeader(OpenDDLParser *this,char *in,char *end)

{
  byte bVar1;
  char *__s;
  pointer ppDVar2;
  bool bVar3;
  Property *pPVar4;
  Property *pPVar5;
  Name *pNVar6;
  Text *this_00;
  pointer __p;
  byte *pbVar7;
  size_t sVar8;
  DDLNode *pDVar9;
  byte *pbVar10;
  pointer __old_p;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prop;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> first;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prev;
  string type;
  Property *prop_;
  unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> name;
  Text *id;
  Name *name_;
  Property *local_b0;
  Property *local_a8;
  Property *local_a0;
  OpenDDLParser *local_98;
  DDLNode *local_90;
  string local_88;
  Property *local_68;
  Name *local_60;
  Text *local_58;
  string local_50;
  
  if (in == end || in == (char *)0x0) {
    return in;
  }
  local_58 = (Text *)0x0;
  local_98 = this;
  pbVar7 = (byte *)parseIdentifier(in,end,&local_58);
  this_00 = local_58;
  pbVar10 = pbVar7;
  while (((pbVar7 != (byte *)end && (pbVar10 = pbVar7, (ulong)*pbVar7 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
    pbVar7 = pbVar7 + 1;
    pbVar10 = (byte *)end;
  }
  if (local_58 == (Text *)0x0) {
    return (char *)pbVar10;
  }
  __s = local_58->m_buffer;
  if (__s == (char *)0x0) {
    pDVar9 = (DDLNode *)0x0;
  }
  else {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,__s,__s + sVar8);
    ppDVar2 = (local_98->m_stack).
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((local_98->m_stack).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppDVar2) {
      pDVar9 = (DDLNode *)0x0;
    }
    else {
      pDVar9 = ppDVar2[-1];
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pDVar9 = DDLNode::create(&local_88,&local_50,pDVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if (pDVar9 == (DDLNode *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"nullptr returned by creating DDLNode.",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  else {
    pushNode(local_98,pDVar9);
  }
  local_90 = pDVar9;
  Text::~Text(this_00);
  operator_delete(this_00);
  local_50._M_dataplus._M_p = (pointer)0x0;
  pbVar7 = (byte *)parseName((char *)pbVar10,end,(Name **)&local_50);
  local_60 = (Name *)local_50._M_dataplus._M_p;
  if ((Name *)local_50._M_dataplus._M_p != (Name *)0x0 && pDVar9 != (DDLNode *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_88,(*(Text **)(local_50._M_dataplus._M_p + 8))->m_buffer,
               (allocator *)&local_a8);
    DDLNode::setName(local_90,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  local_a8 = (Property *)0x0;
  pbVar10 = pbVar7;
  while (((pbVar7 != (byte *)end && (pbVar10 = pbVar7, (ulong)*pbVar7 < 0x2d)) &&
         ((0x100100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
    pbVar7 = pbVar7 + 1;
    pbVar10 = (byte *)end;
  }
  if (*pbVar10 == 0x28) {
    pbVar7 = pbVar10 + 1;
    local_b0 = (Property *)0x0;
    local_a0 = (Property *)0x0;
    bVar3 = pbVar7 == (byte *)end || pbVar10[1] == 0x29;
    if (pbVar7 != (byte *)end && pbVar10[1] != 0x29) {
      do {
        pPVar4 = local_b0;
        local_68 = (Property *)0x0;
        pbVar10 = (byte *)parseProperty((char *)pbVar7,end,&local_68);
        pPVar5 = local_68;
        local_b0 = local_68;
        pbVar7 = pbVar10;
        if (pPVar4 != (Property *)0x0) {
          Property::~Property(pPVar4);
          operator_delete(pPVar4);
        }
        while (((pPVar4 = local_a0, pbVar10 != (byte *)end &&
                (pbVar7 = pbVar10, (ulong)*pbVar10 < 0x2d)) &&
               ((0x100100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))) {
          pbVar10 = pbVar10 + 1;
          pbVar7 = (byte *)end;
        }
        bVar1 = *pbVar7;
        if ((bVar1 != 0x29) && (bVar1 != 0x2c)) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,")","");
          logInvalidTokenError((char *)pbVar7,&local_88,local_98->m_logCallback);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          goto LAB_00707a27;
        }
        if (bVar1 != 0x2c && pPVar5 != (Property *)0x0) {
          if (local_a8 == (Property *)0x0) {
            local_b0 = (Property *)0x0;
            local_a8 = pPVar5;
          }
          pPVar5 = local_b0;
          if (local_a0 != (Property *)0x0) {
            local_b0 = (Property *)0x0;
            local_a0->m_next = pPVar5;
          }
          local_a0 = local_b0;
          local_b0 = (Property *)0x0;
          if (pPVar4 != (Property *)0x0) {
            Property::~Property(pPVar4);
            operator_delete(pPVar4);
          }
        }
        bVar3 = pbVar7 == (byte *)end || *pbVar7 == 0x29;
      } while (pbVar7 != (byte *)end && *pbVar7 != 0x29);
    }
    pbVar7 = pbVar7 + 1;
LAB_00707a27:
    pPVar4 = local_a0;
    if (local_a0 != (Property *)0x0) {
      Property::~Property(local_a0);
      operator_delete(pPVar4);
    }
    if (local_b0 != (Property *)0x0) {
      Property::~Property(local_b0);
      operator_delete(local_b0);
    }
    pbVar10 = pbVar7;
    if (!bVar3) {
      pbVar10 = (byte *)0x0;
      goto LAB_00707a90;
    }
  }
  pPVar4 = local_a8;
  if (local_a8 != (Property *)0x0 && local_90 != (DDLNode *)0x0) {
    local_a8 = (Property *)0x0;
    DDLNode::setProperties(local_90,pPVar4);
  }
LAB_00707a90:
  pPVar4 = local_a8;
  if (local_a8 != (Property *)0x0) {
    Property::~Property(local_a8);
    operator_delete(pPVar4);
  }
  pNVar6 = local_60;
  if (local_60 != (Name *)0x0) {
    Name::~Name(local_60);
    operator_delete(pNVar6);
  }
  return (char *)pbVar10;
}

Assistant:

char *OpenDDLParser::parseHeader( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Text *id( ddl_nullptr );
    in = OpenDDLParser::parseIdentifier( in, end, &id );

#ifdef DEBUG_HEADER_NAME
    dumpId( id );
#endif // DEBUG_HEADER_NAME

    in = lookForNextToken( in, end );
    if( ddl_nullptr != id ) {
        // store the node
        DDLNode *node( createDDLNode( id, this ) );
        if( ddl_nullptr != node ) {
            pushNode( node );
        } else {
            std::cerr << "nullptr returned by creating DDLNode." << std::endl;
        }
        delete id;

		Name *name_(ddl_nullptr);
		in = OpenDDLParser::parseName(in, end, &name_);
		std::unique_ptr<Name> name(name_);
        if( ddl_nullptr != name && ddl_nullptr != node ) {
            const std::string nodeName( name->m_id->m_buffer );
            node->setName( nodeName );
        }


		std::unique_ptr<Property> first;
		in = lookForNextToken(in, end);
		if (*in == Grammar::OpenPropertyToken[0]) {
			in++;
			std::unique_ptr<Property> prop, prev;
			while (*in != Grammar::ClosePropertyToken[0] && in != end) {
				Property *prop_(ddl_nullptr);
				in = OpenDDLParser::parseProperty(in, end, &prop_);
				prop.reset(prop_);
				in = lookForNextToken(in, end);

				if (*in != Grammar::CommaSeparator[0] && *in != Grammar::ClosePropertyToken[0]) {
					logInvalidTokenError(in, Grammar::ClosePropertyToken, m_logCallback);
					return ddl_nullptr;
				}

				if (ddl_nullptr != prop && *in != Grammar::CommaSeparator[0]) {
					if (ddl_nullptr == first) {
						first = std::move(prop);
					}
					if (ddl_nullptr != prev) {
						prev->m_next = prop.release();
					}
					prev = std::move(prop);
				}
			}
			++in;
		}

		// set the properties
		if (first && ddl_nullptr != node) {
			node->setProperties(first.release());
		}
    }

    return in;
}